

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabwidget.cpp
# Opt level: O2

void __thiscall QTabWidget::changeEvent(QTabWidget *this,QEvent *ev)

{
  if (*(short *)(ev + 8) == 100) {
    setUpLayout(this,false);
  }
  QWidget::changeEvent(&this->super_QWidget,ev);
  return;
}

Assistant:

void QTabWidget::changeEvent(QEvent *ev)
{
    if (ev->type() == QEvent::StyleChange
#ifdef Q_OS_MAC
            || ev->type() == QEvent::MacSizeChange
#endif
            )
        setUpLayout();
    QWidget::changeEvent(ev);
}